

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eventAgentTest.cpp
# Opt level: O0

bool __thiscall TestClass::SyncRetFunc3(TestClass *this,uint64_t *p1,uint32_t p2,uint16_t *p3)

{
  ulong uVar1;
  SyncRetEventAgent3<TestClass,_bool,_unsigned_long_&,_unsigned_int,_unsigned_short_&> *this_00;
  ssize_t sVar2;
  size_t __n;
  void *__buf;
  uint param2;
  SyncRetEventAgent3<TestClass,_bool,_unsigned_long_&,_unsigned_int,_unsigned_short_&> *agent;
  bool result;
  uint16_t *p3_local;
  uint32_t p2_local;
  uint64_t *p1_local;
  TestClass *this_local;
  
  uVar1 = EventDispatcher::isThreadCurrent();
  if ((uVar1 & 1) == 0) {
    this_00 = (SyncRetEventAgent3<TestClass,_bool,_unsigned_long_&,_unsigned_int,_unsigned_short_&>
               *)operator_new(0x48,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/eventAgentTest.cpp"
                              ,0x11d);
    __n = 0;
    param2 = (uint)p1;
    SyncRetEventAgent3<TestClass,_bool,_unsigned_long_&,_unsigned_int,_unsigned_short_&>::
    SyncRetEventAgent3(this_00,this,0x10d450,(unsigned_long *)0x0,param2,(unsigned_short *)(ulong)p2
                      );
    sVar2 = SyncRetEventAgent<bool>::send
                      ((SyncRetEventAgent<bool> *)this_00,(int)this + 8,__buf,__n,param2);
    this_local._7_1_ = (bool)((byte)sVar2 & 1);
  }
  else {
    *p1 = *p1 + 0x400;
    *p3 = *p3 + 0x100;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool SyncRetFunc3(uint64_t& p1, uint32_t p2, uint16_t& p3)
	{
		if (not mEventThread.isThreadCurrent())
		{
			bool result = false;
			SyncRetEventAgent3<TestClass, bool, uint64_t &, uint32_t, uint16_t &>* agent =
				jh_new SyncRetEventAgent3<TestClass, bool, uint64_t &, uint32_t, uint16_t &>(this, &TestClass::SyncRetFunc3,
					p1, p2, p3);
			result = agent->send(&mEventThread);
			LOG_INFO("RetVal(%d) p1(%llu) p2(%u) p3(%u)", result, p1, p2, p3);
			return result;
		}
		
		LOG_INFO("Received p1(%llu) p2(%u) p3(%u)", p1, p2, p3);
		p1+=1024;
		p2+=512;
		p3+=256;
		return true;
	}